

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceCellUnionTarget::UpdateMinDistance
          (S2MinDistanceCellUnionTarget *this,S2Point *p,S2MinDistance *min_dist)

{
  bool bVar1;
  S2MinDistanceTarget local_20;
  VType local_18;
  VType VStack_10;
  VType local_8;
  
  local_8 = p->c_[2];
  local_18 = p->c_[0];
  VStack_10 = p->c_[1];
  local_20._vptr_S2DistanceTarget = (_func_int **)&PTR__S2DistanceTarget_003048b0;
  bVar1 = UpdateMinDistance(this,&local_20,min_dist);
  return bVar1;
}

Assistant:

bool S2MinDistanceCellUnionTarget::UpdateMinDistance(
    const S2Point& p, S2MinDistance* min_dist) {
  S2ClosestCellQuery::PointTarget target(p);
  return UpdateMinDistance(&target, min_dist);
}